

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void * yang_read_type(ly_ctx *ctx,void *parent,char *value,yytokentype type)

{
  void *pvVar1;
  char *pcVar2;
  lys_deviate *dev;
  yang_type *typ;
  yytokentype type_local;
  char *value_local;
  void *parent_local;
  ly_ctx *ctx_local;
  
  ctx_local = (ly_ctx *)calloc(1,0x18);
  if (ctx_local == (ly_ctx *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_read_type");
    return (void *)0x0;
  }
  *(undefined1 *)&(ctx_local->dict).hash_tab = 0x80;
  if (type == UNION_KEYWORD) {
    *(ly_ctx **)((long)parent + 0x10) = ctx_local;
    *(void **)((long)&(ctx_local->dict).lock + 8) = parent;
LAB_0017dbba:
    pcVar2 = lydict_insert_zc(ctx,value);
    (ctx_local->dict).lock.__align = (long)pcVar2;
  }
  else {
    if (type == LEAF_KEYWORD) {
      if (*(long *)((long)parent + 0x90) == 0) {
        *(ly_ctx **)((long)parent + 0x90) = ctx_local;
        *(void **)((long)parent + 0x98) = parent;
        *(long *)((long)&(ctx_local->dict).lock + 8) = (long)parent + 0x80;
        goto LAB_0017dbba;
      }
      ly_vlog(ctx,LYE_TOOMANY,LY_VLOG_LYS,parent,"type","leaf");
    }
    else if (type == LEAF_LIST_KEYWORD) {
      if (*(long *)((long)parent + 0x90) == 0) {
        *(ly_ctx **)((long)parent + 0x90) = ctx_local;
        *(void **)((long)parent + 0x98) = parent;
        *(long *)((long)&(ctx_local->dict).lock + 8) = (long)parent + 0x80;
        goto LAB_0017dbba;
      }
      ly_vlog(ctx,LYE_TOOMANY,LY_VLOG_LYS,parent,"type","leaf-list");
    }
    else if (type == TYPEDEF_KEYWORD) {
      if (*(long *)((long)parent + 0x48) == 0) {
        *(ly_ctx **)((long)parent + 0x48) = ctx_local;
        *(long *)((long)&(ctx_local->dict).lock + 8) = (long)parent + 0x38;
        goto LAB_0017dbba;
      }
      ly_vlog(ctx,LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,"type","typedef");
    }
    else if (type == REPLACE_KEYWORD) {
      if (*(long *)((long)parent + 0x28) == 0) {
        pvVar1 = calloc(1,0x40);
        *(void **)((long)parent + 0x28) = pvVar1;
        if (*(long *)((long)parent + 0x28) != 0) {
          *(ly_ctx **)(*(long *)((long)parent + 0x28) + 0x10) = ctx_local;
          *(undefined8 *)((long)&(ctx_local->dict).lock + 8) = *(undefined8 *)((long)parent + 0x28);
          goto LAB_0017dbba;
        }
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_read_type");
      }
      else {
        ly_vlog(ctx,LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,"type","deviation");
      }
    }
    else if (type == EXTENSION_INSTANCE) {
      *(ly_ctx **)((long)parent + 0x10) = ctx_local;
      *(void **)((long)&(ctx_local->dict).lock + 8) = parent;
      goto LAB_0017dbba;
    }
    free(value);
    free(ctx_local);
    ctx_local = (ly_ctx *)0x0;
  }
  return ctx_local;
}

Assistant:

void *
yang_read_type(struct ly_ctx *ctx, void *parent, char *value, enum yytokentype type)
{
    struct yang_type *typ;
    struct lys_deviate *dev;

    typ = calloc(1, sizeof *typ);
    LY_CHECK_ERR_RETURN(!typ, LOGMEM(ctx), NULL);

    typ->flags = LY_YANG_STRUCTURE_FLAG;
    switch (type) {
    case LEAF_KEYWORD:
        if (((struct lys_node_leaf *)parent)->type.der) {
            LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, parent, "type", "leaf");
            goto error;
        }
        ((struct lys_node_leaf *)parent)->type.der = (struct lys_tpdf *)typ;
        ((struct lys_node_leaf *)parent)->type.parent = (struct lys_tpdf *)parent;
        typ->type = &((struct lys_node_leaf *)parent)->type;
        break;
    case LEAF_LIST_KEYWORD:
        if (((struct lys_node_leaflist *)parent)->type.der) {
            LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYS, parent, "type", "leaf-list");
            goto error;
        }
        ((struct lys_node_leaflist *)parent)->type.der = (struct lys_tpdf *)typ;
        ((struct lys_node_leaflist *)parent)->type.parent = (struct lys_tpdf *)parent;
        typ->type = &((struct lys_node_leaflist *)parent)->type;
        break;
    case UNION_KEYWORD:
        ((struct lys_type *)parent)->der = (struct lys_tpdf *)typ;
        typ->type = (struct lys_type *)parent;
        break;
    case TYPEDEF_KEYWORD:
        if (((struct lys_tpdf *)parent)->type.der) {
            LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_NONE, NULL, "type", "typedef");
            goto error;
        }
        ((struct lys_tpdf *)parent)->type.der = (struct lys_tpdf *)typ;
        typ->type = &((struct lys_tpdf *)parent)->type;
        break;
    case REPLACE_KEYWORD:
        /* deviation replace type*/
        dev = (struct lys_deviate *)parent;
        if (dev->type) {
            LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_NONE, NULL, "type", "deviation");
            goto error;
        }
        dev->type = calloc(1, sizeof *dev->type);
        LY_CHECK_ERR_GOTO(!dev->type, LOGMEM(ctx), error);
        dev->type->der = (struct lys_tpdf *)typ;
        typ->type = dev->type;
        break;
    case EXTENSION_INSTANCE:
        ((struct lys_type *)parent)->der = (struct lys_tpdf *)typ;
        typ->type = parent;
        break;
    default:
        goto error;
        break;
    }
    typ->name = lydict_insert_zc(ctx, value);
    return typ;

error:
    free(value);
    free(typ);
    return NULL;
}